

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

int __thiscall ON_ClippingRegion::IsVisible(ON_ClippingRegion *this,int count,ON_3dPoint *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double clip_plane_tolerance;
  int j;
  int i;
  uint cpbit;
  uint some_out;
  uint all_out;
  uint out;
  double w;
  double x;
  double *cv;
  ON_PlaneEquation *cpeqn;
  double *xform;
  ON_3dPoint *p_local;
  int count_local;
  ON_ClippingRegion *this_local;
  
  dVar1 = ClipPlaneTolerance(this);
  i = 0;
  cpbit = 0xffffffff;
  clip_plane_tolerance._4_4_ = count;
  x = (double)p;
  while (clip_plane_tolerance._4_4_ != 0) {
    some_out = 0;
    if (this->m_clip_plane_count != 0) {
      j = 0x40;
      cv = (double *)&this->field_0x110;
      clip_plane_tolerance._0_4_ = this->m_clip_plane_count;
      while (clip_plane_tolerance._0_4_ != 0) {
        if (cv[2] * *(double *)((long)x + 0x10) +
            *cv * *(double *)x + cv[1] * *(double *)((long)x + 8) + cv[3] < -dVar1) {
          some_out = j | some_out;
        }
        j = j << 1;
        cv = cv + 4;
        clip_plane_tolerance._0_4_ = clip_plane_tolerance._0_4_ + -1;
      }
    }
    dVar2 = (this->m_xform).m_xform[3][2] * *(double *)((long)x + 0x10) +
            (this->m_xform).m_xform[3][0] * *(double *)x +
            (this->m_xform).m_xform[3][1] * *(double *)((long)x + 8) + (this->m_xform).m_xform[3][3]
    ;
    dVar3 = (this->m_xform).m_xform[0][2] * *(double *)((long)x + 0x10) +
            (this->m_xform).m_xform[0][0] * *(double *)x +
            (this->m_xform).m_xform[0][1] * *(double *)((long)x + 8) + (this->m_xform).m_xform[0][3]
    ;
    if (-dVar2 <= dVar3) {
      if (dVar2 < dVar3) {
        some_out = some_out | 2;
      }
    }
    else {
      some_out = some_out | 1;
    }
    dVar3 = (this->m_xform).m_xform[1][2] * *(double *)((long)x + 0x10) +
            (this->m_xform).m_xform[1][0] * *(double *)x +
            (this->m_xform).m_xform[1][1] * *(double *)((long)x + 8) + (this->m_xform).m_xform[1][3]
    ;
    if (-dVar2 <= dVar3) {
      if (dVar2 < dVar3) {
        some_out = some_out | 8;
      }
    }
    else {
      some_out = some_out | 4;
    }
    dVar3 = (this->m_xform).m_xform[2][2] * *(double *)((long)x + 0x10) +
            (this->m_xform).m_xform[2][0] * *(double *)x +
            (this->m_xform).m_xform[2][1] * *(double *)((long)x + 8) + (this->m_xform).m_xform[2][3]
    ;
    if (-dVar2 <= dVar3) {
      if (dVar2 < dVar3) {
        some_out = some_out | 0x20;
      }
    }
    else {
      some_out = some_out | 0x10;
    }
    i = some_out | i;
    cpbit = some_out & cpbit;
    if ((i != 0) && (cpbit == 0)) break;
    x = (double)((long)x + 0x18);
    clip_plane_tolerance._4_4_ = clip_plane_tolerance._4_4_ + -1;
  }
  if (cpbit == 0) {
    if (i == 0) {
      clip_plane_tolerance._4_4_ = 2;
    }
    else {
      clip_plane_tolerance._4_4_ = 1;
    }
  }
  else {
    clip_plane_tolerance._4_4_ = 0;
  }
  return clip_plane_tolerance._4_4_;
}

Assistant:

int ON_ClippingRegion::IsVisible( int count, const ON_3dPoint* p ) const
{
  const double* xform;
  const ON_PlaneEquation* cpeqn;
  const double* cv;
  double x, w;
  unsigned int out, all_out, some_out, cpbit;
  int i, j;

  // 14 May 2012 Dale Lear
  //   Fix http://dev.mcneel.com/bugtrack/?q=102481
  //   Picking hatches that are coplanar with clipping planes.
  //   The "fix" was to set clipping_plane_tolerance = same
  //   tolerance the display code uses.  Before the fix,
  //   0.0 was used as the clipping_plane_tolerance.
  const double clip_plane_tolerance = ClipPlaneTolerance();

  some_out = 0;
  all_out  = 0xFFFFFFFF;
  xform = &m_xform.m_xform[0][0];
  cv = &p[0].x;
  for ( i = count; i--; cv += 3 )
  {
    out = 0;
    if ( m_clip_plane_count )
    {
      cpbit = 0x40;
      cpeqn = m_clip_plane;
      j = m_clip_plane_count;
      while (j--)
      {
        x = cpeqn->x*cv[0] + cpeqn->y*cv[1] + cpeqn->z*cv[2] + cpeqn->d;
        if ( x < -clip_plane_tolerance )
          out |= cpbit;
        cpbit <<= 1;
        cpeqn++;
      }
    }
    w = xform[12]*cv[0] + xform[13]*cv[1] + xform[14]*cv[2] + xform[15];
    x = xform[0]*cv[0] + xform[1]*cv[1] + xform[2]*cv[2] + xform[3];
    if (x < -w) out |= 0x01; else if (x > w) out |= 0x02;
    x = xform[4]*cv[0] + xform[5]*cv[1] + xform[6]*cv[2] + xform[7];
    if (x < -w) out |= 0x04; else if (x > w) out |= 0x08;
    x = xform[8]*cv[0] + xform[9]*cv[1] + xform[10]*cv[2] + xform[11];
    if (x < -w) out |= 0x10; else if (x > w) out |= 0x20;
    some_out |= out;
    all_out  &= out;
    if ( some_out && !all_out )
    {
      //  no further "out" checking is necessary
      break;
    }
  }

  if ( all_out )
    i = 0;
  else if ( some_out )
    i = 1;
  else
    i = 2;

  return i;
}